

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void free_SNode(Parser *p,SNode *s)

{
  uint32 uVar1;
  uint local_1c;
  uint i;
  SNode *s_local;
  Parser *p_local;
  
  for (local_1c = 0; local_1c < (s->zns).n; local_1c = local_1c + 1) {
    if ((s->zns).v[local_1c] != (ZNode *)0x0) {
      free_ZNode(p,(s->zns).v[local_1c],s);
    }
  }
  if (((s->zns).v != (ZNode **)0x0) && ((s->zns).v != (s->zns).e)) {
    free((s->zns).v);
  }
  (s->zns).n = 0;
  (s->zns).v = (ZNode **)0x0;
  if ((s->last_pn != (PNode *)0x0) &&
     (uVar1 = s->last_pn->refcount - 1, s->last_pn->refcount = uVar1, uVar1 == 0)) {
    free_PNode(p,s->last_pn);
  }
  free(s);
  return;
}

Assistant:

static void free_SNode(Parser *p, struct SNode *s) {
  uint i;
  for (i = 0; i < s->zns.n; i++)
    if (s->zns.v[i]) free_ZNode(p, s->zns.v[i], s);
  vec_free(&s->zns);
  if (s->last_pn) unref_pn(p, s->last_pn);
#ifdef USE_FREELISTS
  s->all_next = p->free_snodes;
  p->free_snodes = s;
#else
  FREE(s);
#endif
}